

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsEx<ImPlot::GetterBarV<unsigned_long_long>>
               (char *label_id,GetterBarV<unsigned_long_long> *getter,double width)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  unsigned_long_long *puVar6;
  ImPlotPlot *pIVar7;
  unsigned_long_long uVar8;
  double dVar9;
  double dVar10;
  ImPlotContext *pIVar11;
  bool bVar12;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar13;
  int iVar14;
  int iVar15;
  ImPlotRange *pIVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  ImVec2 b;
  ImVec2 a;
  byte local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar12 = BeginItem(label_id,1);
  pIVar11 = GImPlot;
  if (bVar12) {
    dVar26 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar13 = getter->Count, 0 < iVar13)) {
      dVar19 = getter->XShift;
      puVar6 = getter->Ys;
      iVar15 = getter->Offset;
      iVar2 = getter->Stride;
      pIVar7 = GImPlot->CurrentPlot;
      iVar3 = pIVar7->CurrentYAxis;
      uVar4 = (pIVar7->XAxis).Flags;
      pIVar16 = GImPlot->ExtentsY + iVar3;
      uVar5 = pIVar7->YAxis[iVar3].Flags;
      iVar14 = 0;
      dVar21 = 0.0;
      do {
        dVar22 = dVar19 + dVar21;
        uVar8 = *(unsigned_long_long *)
                 ((long)puVar6 +
                 (long)(((iVar15 + iVar14) % iVar13 + iVar13) % iVar13) * (long)iVar2);
        auVar25._8_4_ = (int)(uVar8 >> 0x20);
        auVar25._0_8_ = uVar8;
        auVar25._12_4_ = 0x45300000;
        dVar23 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
        dVar24 = dVar22 - dVar26;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((long)ABS(dVar24) < 0x7ff0000000000000) {
LAB_001f1e06:
            if ((0.0 < dVar24) || ((uVar4 & 0x20) == 0)) {
              dVar9 = (pIVar11->ExtentsX).Min;
              dVar10 = (pIVar11->ExtentsX).Max;
              uVar17 = -(ulong)(dVar24 < dVar9);
              uVar18 = -(ulong)(dVar10 < dVar24);
              (pIVar11->ExtentsX).Min = (double)(~uVar17 & (ulong)dVar9 | (ulong)dVar24 & uVar17);
              (pIVar11->ExtentsX).Max = (double)(~uVar18 & (ulong)dVar10 | (ulong)dVar24 & uVar18);
            }
          }
        }
        else if ((((long)ABS(dVar24) < 0x7ff0000000000000) &&
                 (pIVar7->YAxis[iVar3].Range.Min <= dVar23)) &&
                (dVar23 <= pIVar7->YAxis[iVar3].Range.Max)) goto LAB_001f1e06;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((uVar8 != 0) || ((uVar5 & 0x20) == 0)) {
LAB_001f1e8f:
            dVar24 = pIVar11->ExtentsY[iVar3].Max;
            uVar17 = -(ulong)(dVar23 < pIVar16->Min);
            uVar18 = -(ulong)(dVar24 < dVar23);
            pIVar16->Min = (double)(~uVar17 & (ulong)pIVar16->Min | (ulong)dVar23 & uVar17);
            pIVar11->ExtentsY[iVar3].Max =
                 (double)(~uVar18 & (ulong)dVar24 | (ulong)dVar23 & uVar18);
          }
        }
        else if ((((pIVar7->XAxis).Range.Min <= dVar24) && (dVar24 <= (pIVar7->XAxis).Range.Max)) &&
                (local_44 = (byte)((uVar5 & 0x20) >> 5), (uVar8 == 0 & local_44) == 0))
        goto LAB_001f1e8f;
        dVar22 = dVar22 + dVar26;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((long)ABS(dVar22) < 0x7ff0000000000000) {
LAB_001f1f01:
            if ((0.0 < dVar22) || ((uVar4 & 0x20) == 0)) {
              dVar23 = (pIVar11->ExtentsX).Min;
              dVar24 = (pIVar11->ExtentsX).Max;
              uVar17 = -(ulong)(dVar22 < dVar23);
              uVar18 = -(ulong)(dVar24 < dVar22);
              (pIVar11->ExtentsX).Min = (double)(~uVar17 & (ulong)dVar23 | (ulong)dVar22 & uVar17);
              (pIVar11->ExtentsX).Max = (double)(~uVar18 & (ulong)dVar24 | (ulong)dVar22 & uVar18);
            }
          }
        }
        else if ((((long)ABS(dVar22) < 0x7ff0000000000000) &&
                 (pIVar7->YAxis[iVar3].Range.Min <= 0.0)) && (0.0 <= pIVar7->YAxis[iVar3].Range.Max)
                ) goto LAB_001f1f01;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((uVar5 & 0x20) == 0) {
LAB_001f1f7b:
            dVar22 = pIVar11->ExtentsY[iVar3].Max;
            pIVar16->Min = (double)(-(ulong)(pIVar16->Min <= 0.0) & (ulong)pIVar16->Min);
            pIVar11->ExtentsY[iVar3].Max = (double)(-(ulong)(0.0 <= dVar22) & (ulong)dVar22);
          }
        }
        else if ((((uVar5 & 0x20) == 0) && ((pIVar7->XAxis).Range.Min <= dVar22)) &&
                (dVar22 <= (pIVar7->XAxis).Range.Max)) goto LAB_001f1f7b;
        dVar21 = dVar21 + 1.0;
        iVar14 = iVar14 + 1;
      } while (iVar13 != iVar14);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar11->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar11->NextItemData).Colors + 1);
    iVar13 = getter->Count;
    if (0 < iVar13) {
      bVar12 = (pIVar11->NextItemData).RenderFill;
      bVar1 = (pIVar11->NextItemData).RenderLine;
      iVar15 = 0;
      do {
        uVar8 = *(unsigned_long_long *)
                 ((long)getter->Ys +
                 (long)(((getter->Offset + iVar15) % iVar13 + iVar13) % iVar13) *
                 (long)getter->Stride);
        if (uVar8 != 0) {
          auVar20._8_4_ = (int)(uVar8 >> 0x20);
          auVar20._0_8_ = uVar8;
          auVar20._12_4_ = 0x45300000;
          dVar19 = (double)iVar15 + getter->XShift;
          local_38 = PlotToPixels(dVar19 - dVar26,
                                  (auVar20._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0),-1)
          ;
          local_40 = PlotToPixels(dVar19 + dVar26,0.0,-1);
          if ((pIVar11->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar12 ^ 1U | col != col_00) & bVar1) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar11->NextItemData).LineWeight);
          }
          iVar13 = getter->Count;
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 < iVar13);
    }
    pIVar11 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar11->NextItemData);
    pIVar11->PreviousItem = pIVar11->CurrentItem;
    pIVar11->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}